

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>
::val(FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>
      *this)

{
  double dVar1;
  FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *pFVar2;
  double dVar3;
  double dVar4;
  
  dVar1 = (this->left_->fadexpr_).left_.constant_;
  pFVar2 = (this->left_->fadexpr_).right_;
  dVar3 = ::exp((pFVar2->fadexpr_).expr_.fadexpr_.left_.constant_ *
                ((pFVar2->fadexpr_).expr_.fadexpr_.right_)->val_);
  dVar4 = sin((this->right_->fadexpr_).expr_.fadexpr_.left_.constant_ *
              ((this->right_->fadexpr_).expr_.fadexpr_.right_)->val_);
  return dVar4 * dVar3 * dVar1;
}

Assistant:

const value_type val() const {return left_.val() * right_.val() ;}